

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O0

value_type_conflict8
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::StoreT<float>,float>(float *in)

{
  string_view tag_00;
  cx_string<1UL> cVar1;
  float fVar2;
  string_view sVar3;
  cx_string<1UL> tag;
  InputStream istream;
  StoreT<float> visitor;
  OutputStream ostream;
  stringstream stream;
  OutputStream *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined6 in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe40;
  cx_string<1UL> cVar4;
  StoreT<float> local_1b0;
  long *local_1a8;
  long local_190 [2];
  StoreT<float> *in_stack_fffffffffffffe80;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_190);
  std::ios::exceptions((int)local_190 + (int)*(undefined8 *)(local_190[0] + -0x18));
  local_1a8 = local_190;
  mserialize::serialize<float,OutputStream>
            ((float *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  anon_unknown.dwarf_ae198::StoreT<float>::StoreT(&local_1b0);
  cVar1 = mserialize::tag<float>();
  cVar4 = cVar1;
  sVar3 = mserialize::cx_string::operator_cast_to_string_view((cx_string<1UL> *)0x1c3935);
  tag_00._len._0_6_ = in_stack_fffffffffffffe40;
  tag_00._ptr = (char *)sVar3._len;
  tag_00._len._6_1_ = cVar4._data[0];
  tag_00._len._7_1_ = cVar4._data[1];
  mserialize::visit<(anonymous_namespace)::StoreT<float>,InputStream>
            (tag_00,(StoreT<float> *)sVar3._ptr,
             (InputStream *)CONCAT26(cVar1._data,in_stack_fffffffffffffe28));
  fVar2 = anon_unknown.dwarf_ae198::StoreT<float>::value(in_stack_fffffffffffffe80);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
  return fVar2;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}